

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O3

void __thiscall
HashtableIntTest_InsertRange_Test<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::~HashtableIntTest_InsertRange_Test
          (HashtableIntTest_InsertRange_Test<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  (this->
  super_HashtableIntTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ).
  super_HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  .super_Test._vptr_Test = (_func_int **)&PTR__HashtableTest_00c16c28;
  (this->
  super_HashtableIntTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ).
  super_HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  .ht_.
  super_BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ._vptr_BaseHashtableInterface = (_func_int **)&PTR__BaseHashtableInterface_00c16ce8;
  std::
  vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~vector(&(this->
             super_HashtableIntTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ).
             super_HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_.
             super_BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_.rep.table.groups);
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TYPED_TEST(HashtableIntTest, InsertRange) {
  // We just test the ints here, to make the placement-new easier.
  TypeParam ht_source;
  ht_source.insert(this->UniqueObject(10));
  ht_source.insert(this->UniqueObject(100));
  ht_source.insert(this->UniqueObject(1000));
  ht_source.insert(this->UniqueObject(10000));
  ht_source.insert(this->UniqueObject(100000));
  ht_source.insert(this->UniqueObject(1000000));

  const typename TypeParam::value_type input[] = {
      // This is a copy of the first element in ht_source.
      *ht_source.begin(), this->UniqueObject(2), this->UniqueObject(4),
      this->UniqueObject(8)};

  set<typename TypeParam::value_type> set_input;
  set_input.insert(this->UniqueObject(1111111));
  set_input.insert(this->UniqueObject(111111));
  set_input.insert(this->UniqueObject(11111));
  set_input.insert(this->UniqueObject(1111));
  set_input.insert(this->UniqueObject(111));
  set_input.insert(this->UniqueObject(11));

  // Insert from ht_source, an iterator of the same type as us.
  typename TypeParam::const_iterator begin = ht_source.begin();
  typename TypeParam::const_iterator end = begin;
  std::advance(end, 3);
  this->ht_.insert(begin, end);  // insert 3 elements from ht_source
  EXPECT_EQ(3u, this->ht_.size());
  EXPECT_TRUE(*this->ht_.begin() == this->UniqueObject(10) ||
              *this->ht_.begin() == this->UniqueObject(100) ||
              *this->ht_.begin() == this->UniqueObject(1000) ||
              *this->ht_.begin() == this->UniqueObject(10000) ||
              *this->ht_.begin() == this->UniqueObject(100000) ||
              *this->ht_.begin() == this->UniqueObject(1000000));

  // And insert from set_input, a separate, non-random-access iterator.
  typename set<typename TypeParam::value_type>::const_iterator set_begin;
  typename set<typename TypeParam::value_type>::const_iterator set_end;
  set_begin = set_input.begin();
  set_end = set_begin;
  std::advance(set_end, 3);
  this->ht_.insert(set_begin, set_end);
  EXPECT_EQ(6u, this->ht_.size());

  // Insert from input as well, a separate, random-access iterator.
  // The first element of input overlaps with an existing element
  // of ht_, so this should only up the size by 2.
  this->ht_.insert(&input[0], &input[3]);
  EXPECT_EQ(8u, this->ht_.size());
}